

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O3

void Bmc_CexEssentialBitTest(Gia_Man_t *p,Abc_Cex_t *pCexState)

{
  uint uVar1;
  int iVar2;
  Abc_Cex_t *p_00;
  char *__s;
  int iBit;
  ulong uVar3;
  
  iVar2 = pCexState->nBits;
  if (0 < iVar2) {
    uVar3 = 0;
    do {
      iBit = (int)uVar3;
      if ((int)(uVar3 / 100) * 100 == iBit) {
        p_00 = Bmc_CexEssentialBitOne(p,pCexState,iBit,(Abc_Cex_t *)0x0,(int *)0x0);
        Abc_CexPrintStatsInputs(p_00,p->vCis->nSize - p->nRegs);
        uVar1 = pCexState->iPo;
        iVar2 = p->vCos->nSize;
        if (iVar2 - p->nRegs <= (int)uVar1) {
          __assert_fail("v < Gia_ManPoNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
        }
        if (((int)uVar1 < 0) || (iVar2 <= (int)uVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = p->vCos->pArray[uVar1];
        if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        __s = "Essential";
        if ((*(ulong *)(p->pObjs + iVar2) >> 0x3e & 1) != 0) {
          __s = "Not essential";
        }
        puts(__s);
        Abc_CexFree(p_00);
        iVar2 = pCexState->nBits;
      }
      uVar3 = (ulong)(iBit + 1U);
    } while ((int)(iBit + 1U) < iVar2);
  }
  return;
}

Assistant:

void Bmc_CexEssentialBitTest( Gia_Man_t * p, Abc_Cex_t * pCexState )
{
    Abc_Cex_t * pNew;
    int b;
    for ( b = 0; b < pCexState->nBits; b++ )
    {
        if ( b % 100 )
            continue;
        pNew = Bmc_CexEssentialBitOne( p, pCexState, b, NULL, NULL );
        Bmc_CexPrint( pNew, Gia_ManPiNum(p), 0 );

        if ( Gia_ManPo(p, pCexState->iPo)->fMark1 )
            printf( "Not essential\n" );
        else
            printf( "Essential\n" );

        Abc_CexFree( pNew );
    }
}